

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

void rw::ps2::printDMAVIF(InstanceData *inst)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  
  puVar1 = (uint *)inst->data;
  puVar3 = puVar1;
LAB_00122aeb:
  do {
    uVar4 = *puVar3;
    uVar2 = uVar4 & 0x70000000;
    do {
      if (uVar2 == 0x60000000) {
        printf("DMAret %04x %08x\n",(ulong)(uVar4 & 0xffff),(ulong)puVar3[1]);
        sendVIF(puVar3[2]);
        sendVIF(puVar3[3]);
        dmaVIF(uVar4 & 0xffff,puVar3 + 4);
        putchar(10);
        return;
      }
      if (uVar2 == 0x30000000) {
        printf("DMAref %04x %08x\n",(ulong)(uVar4 & 0xffff),(ulong)puVar3[1]);
        sendVIF(puVar3[2]);
        sendVIF(puVar3[3]);
        dmaVIF(uVar4 & 0xffff,puVar1 + (puVar3[1] << 2));
        puVar3 = puVar3 + 4;
        goto LAB_00122aeb;
      }
    } while (uVar2 != 0x10000000);
    uVar4 = uVar4 & 0xffff;
    printf("DMAcnt %04x %08x\n",(ulong)uVar4,(ulong)puVar3[1]);
    sendVIF(puVar3[2]);
    sendVIF(puVar3[3]);
    dmaVIF(uVar4,puVar3 + 4);
    puVar3 = (uint *)((long)puVar3 + (ulong)(uVar4 << 4) + 0x10);
  } while( true );
}

Assistant:

void
printDMAVIF(InstanceData *inst)
{
	uint32 *tag = (uint32*)inst->data;
	uint32 *base = (uint32*)inst->data;
	uint32 qwc;

	for(;;){
		qwc = tag[0]&0xFFFF;
		switch(tag[0]&0x70000000){
		case DMAcnt:
			printf("DMAcnt %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, tag+4);
			tag += (1+qwc)*4;
			break;

		case DMAref:
			printf("DMAref %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, base + tag[1]*4);
			tag += 4;
			break;

		case DMAret:
			printf("DMAret %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, tag+4);
			printf("\n");
			return;
		}
	}
}